

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowConstantAggregatorGlobalState::WindowConstantAggregatorGlobalState
          (WindowConstantAggregatorGlobalState *this,ClientContext *context,
          WindowConstantAggregator *aggregator,idx_t group_count,ValidityMask *partition_mask)

{
  vector<unsigned_long,_true> *this_00;
  unsigned_long *puVar1;
  iterator iVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  unsigned_long uVar7;
  ulong uVar8;
  idx_t start;
  unsigned_long local_68;
  default_delete<duckdb::Vector> *local_60;
  Vector *local_58;
  LogicalType local_50;
  WindowConstantAggregator *local_38;
  
  local_68 = group_count;
  WindowAggregatorGlobalState::WindowAggregatorGlobalState
            (&this->super_WindowAggregatorGlobalState,context,&aggregator->super_WindowAggregator,
             0x800);
  (this->super_WindowAggregatorGlobalState).super_WindowAggregatorState._vptr_WindowAggregatorState
       = (_func_int **)&PTR__WindowConstantAggregatorGlobalState_019cc578;
  this_00 = &this->partition_offsets;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  WindowAggregateStates::WindowAggregateStates
            (&this->statef,&(this->super_WindowAggregatorGlobalState).aggr);
  local_60 = (default_delete<duckdb::Vector> *)&this->results;
  (this->results).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  local_38 = aggregator;
  if ((partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
      (unsigned_long *)0x0) {
    local_50._0_8_ = (ulong)(uint)local_50._4_4_ << 0x20;
    __position._M_current =
         (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<int>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,__position,
                 (int *)&local_50);
    }
    else {
      *__position._M_current = 0;
      (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    local_50.id_ = INVALID;
    local_50.physical_type_ = ~INVALID;
    local_50._2_6_ = 0;
    if (local_68 != 0) {
      do {
        puVar1 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar7 = 0xffffffffffffffff;
        }
        else {
          uVar7 = puVar1[(ulong)local_50._0_8_ >> 6];
        }
        uVar8 = (ulong)(local_50._0_4_ & 0x3f);
        if (uVar7 == 0 && uVar8 == 0) {
          local_50._0_8_ = local_50._0_8_ + 0x40;
        }
        else {
          while ((ulong)local_50._0_8_ < local_68) {
            if ((uVar7 >> (uVar8 & 0x3f) & 1) != 0) {
              iVar2._M_current =
                   (this->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (this->partition_offsets).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,
                           (unsigned_long *)&local_50);
              }
              else {
                *iVar2._M_current = local_50._0_8_;
                (this->partition_offsets).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
            }
            local_50._0_8_ = local_50._0_8_ + 1;
            if (0x3e < uVar8) break;
            uVar8 = uVar8 + 1;
          }
        }
      } while ((ulong)local_50._0_8_ < local_68);
    }
  }
  puVar3 = (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar6 = (Vector *)operator_new(0x68);
  LogicalType::LogicalType(&local_50,&(local_38->super_WindowAggregator).result_type);
  Vector::Vector(pVVar6,&local_50,(long)puVar3 - (long)puVar4 >> 3);
  local_58 = pVVar6;
  LogicalType::~LogicalType(&local_50);
  pVVar5 = local_58;
  local_58 = (Vector *)0x0;
  pVVar6 = *(Vector **)local_60;
  *(Vector **)local_60 = pVVar5;
  if (pVVar6 != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()(local_60,pVVar6);
  }
  if (local_58 != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&local_58,local_58);
  }
  WindowAggregateStates::Initialize
            (&this->statef,
             (long)(this->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  iVar2._M_current =
       (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,&local_68);
  }
  else {
    *iVar2._M_current = local_68;
    (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

WindowConstantAggregatorGlobalState::WindowConstantAggregatorGlobalState(ClientContext &context,
                                                                         const WindowConstantAggregator &aggregator,
                                                                         idx_t group_count,
                                                                         const ValidityMask &partition_mask)
    : WindowAggregatorGlobalState(context, aggregator, STANDARD_VECTOR_SIZE), statef(aggr) {

	// Locate the partition boundaries
	if (partition_mask.AllValid()) {
		partition_offsets.emplace_back(0);
	} else {
		idx_t entry_idx;
		idx_t shift;
		for (idx_t start = 0; start < group_count;) {
			partition_mask.GetEntryIndex(start, entry_idx, shift);

			//	If start is aligned with the start of a block,
			//	and the block is blank, then skip forward one block.
			const auto block = partition_mask.GetValidityEntry(entry_idx);
			if (partition_mask.NoneValid(block) && !shift) {
				start += ValidityMask::BITS_PER_VALUE;
				continue;
			}

			// Loop over the block
			for (; shift < ValidityMask::BITS_PER_VALUE && start < group_count; ++shift, ++start) {
				if (partition_mask.RowIsValid(block, shift)) {
					partition_offsets.emplace_back(start);
				}
			}
		}
	}

	//	Initialise the vector for caching the results
	results = make_uniq<Vector>(aggregator.result_type, partition_offsets.size());

	//	Initialise the final states
	statef.Initialize(partition_offsets.size());

	// Add final guard
	partition_offsets.emplace_back(group_count);
}